

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O1

fec_t * fec_new(uint k,uint n)

{
  fec_t *pfVar1;
  gf *pgVar2;
  ulong uVar3;
  gf *pgVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  gf *a;
  code *pcStack_40;
  undefined8 local_38;
  
  if (fec_new_gf_initialized == '\0') {
    pcStack_40 = (code *)0x106d78;
    gf_init();
    fec_new_gf_initialized = '\x01';
  }
  pcStack_40 = (code *)0x106d89;
  pfVar1 = (fec_t *)malloc(0x10);
  if (pfVar1 != (fec_t *)0x0) {
    uVar6 = (ulong)k;
    pcStack_40 = (code *)0x106da4;
    pgVar2 = (gf *)malloc(n * uVar6);
    pfVar1->gen_matrix = pgVar2;
    if (pgVar2 != (gf *)0x0) {
      pfVar1->k = k;
      pfVar1->n = n;
      uVar3 = (ulong)(n * k) + 0xf & 0xfffffffffffffff0;
      lVar7 = -uVar3;
      a = (gf *)((long)&local_38 + lVar7);
      local_38 = pfVar1;
      *(undefined1 *)((long)&local_38 - uVar3) = 1;
      if (1 < k) {
        *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x106df7;
        memset((void *)((long)&local_38 + lVar7 + 1),0,(ulong)(k - 1));
      }
      if (n != 1) {
        iVar5 = 0;
        pgVar4 = a;
        do {
          pgVar4 = pgVar4 + uVar6;
          if (k != 0) {
            uVar3 = 0;
            uVar8 = 0;
            do {
              pgVar4[uVar8] = gf_polys[(uint)((int)(uVar3 / 0xff) * -0xff + (int)uVar3)];
              uVar8 = uVar8 + 1;
              uVar3 = (ulong)(uint)((int)uVar3 + iVar5);
            } while (uVar6 != uVar8);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != n - 1);
      }
      *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x106e5a;
      matrix_inv_vandermonde(a,k);
      *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x106e7b;
      matrix_mul(a + k * k,a,pgVar2 + k * k,n - k,k,k);
      if (k != 0) {
        lVar7 = 0;
        uVar3 = 0;
        do {
          uVar8 = 0;
          do {
            pgVar2[(uint)((int)lVar7 + (int)uVar8)] = uVar3 == uVar8;
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
          uVar3 = uVar3 + 1;
          lVar7 = lVar7 + uVar6;
        } while (uVar3 != uVar6);
      }
      return local_38;
    }
    pcStack_40 = fec_encode;
    __assert_fail("res->gen_matrix != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0x32,
                  "fec_t *fec_new(unsigned int, unsigned int)");
  }
  pcStack_40 = (code *)0x106ed6;
  __assert_fail("res != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",
                0x30,"fec_t *fec_new(unsigned int, unsigned int)");
}

Assistant:

fec_t *fec_new(unsigned int k, unsigned int n) {
  assert((k <= n ) || "k is too big");
  assert((k <= 256) || "k is too big");
  assert((n <= 256) || "n is too big");

  /*M
    Init Galois arithmetic if not already initialized.
  **/
  static int gf_initialized = 0;
  if (!gf_initialized) {
    gf_init();
    gf_initialized = 1;
  }

  fec_t *res;
  res = malloc(sizeof(fec_t));
  assert(res != NULL);
  res->gen_matrix = malloc(sizeof(gf)*k*n);
  assert(res->gen_matrix != NULL);

  res->k = k;
  res->n = n;

  /*M
    Fill the matrix with powers of field elements.
  **/
  gf tmp[k*n];
  /*  gf *tmp = res->gen_matrix; */

  /*M
    First row is special (powers of $0$).
  **/
  tmp[0] = 1;
  unsigned int col;
  for (col = 1; col < k; col++)
    tmp[col] = 0;
  
  gf *p;
  unsigned int row;
  for (p = tmp + k, row = 0; row < n - 1; row++, p += k) {
    for (col = 0; col < k; col++)
      p[col] = gf_polys[(row * col) % 255];
  }

#ifdef DEBUG
  fprintf(stderr, "first vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Invert the upper $k \times k$ vandermonde matrix.
  **/
  matrix_inv_vandermonde(tmp, k);

#ifdef DEBUG
  fprintf(stderr, "\ninverted vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Multiply the inverted upper $k \times k$ vandermonde matrix with
    the lower band of the matrix.
  **/
  matrix_mul(tmp + k * k, tmp, res->gen_matrix + k * k, n - k, k, k);

  /*M
    Fill the upper $k \times k$ matrix with the identity matrix to
    generate a systematic matrix.
  **/
  for (row = 0; row < k; row++)
    for (col = 0; col < k; col++)
      if (col == row)
        res->gen_matrix[row * k + col] = 1;
      else
        res->gen_matrix[row * k + col] = 0;

#ifdef DEBUG
  fprintf(stderr, "\ngenerated matrix\n");
  matrix_print(res->gen_matrix, res->n, res->k);
#endif
  
  return res;
}